

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int __thiscall testing::internal::UnitTestImpl::successful_test_count(UnitTestImpl *this)

{
  int iVar1;
  pointer ppTVar2;
  int iVar3;
  ulong uVar4;
  
  ppTVar2 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->test_cases_).
      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppTVar2) {
    iVar3 = 0;
  }
  else {
    uVar4 = 0;
    iVar3 = 0;
    do {
      iVar1 = TestCase::successful_test_count(ppTVar2[uVar4]);
      iVar3 = iVar3 + iVar1;
      uVar4 = uVar4 + 1;
      ppTVar2 = (this->test_cases_).
                super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->test_cases_).
                                   super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2 >> 3))
    ;
  }
  return iVar3;
}

Assistant:

Message& Message::operator <<(const wchar_t* wide_c_str) {
  return *this << internal::String::ShowWideCString(wide_c_str);
}